

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_frame_codec.c
# Opt level: O0

int amqp_frame_codec_encode_empty_frame
              (AMQP_FRAME_CODEC_HANDLE amqp_frame_codec,uint16_t channel,
              ON_BYTES_ENCODED on_bytes_encoded,void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG p_Stack_38;
  uchar channel_bytes [2];
  LOGGER_LOG l;
  int result;
  void *callback_context_local;
  ON_BYTES_ENCODED on_bytes_encoded_local;
  uint16_t channel_local;
  AMQP_FRAME_CODEC_HANDLE amqp_frame_codec_local;
  
  if (amqp_frame_codec == (AMQP_FRAME_CODEC_HANDLE)0x0) {
    p_Stack_38 = xlogging_get_log_function();
    if (p_Stack_38 != (LOGGER_LOG)0x0) {
      (*p_Stack_38)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                    ,"amqp_frame_codec_encode_empty_frame",0x15b,1,"NULL amqp_frame_codec");
    }
    l._4_4_ = 0x15c;
  }
  else {
    l_1._6_1_ = (undefined1)(channel >> 8);
    l_1._7_1_ = (undefined1)channel;
    iVar1 = frame_codec_encode_frame
                      (amqp_frame_codec->frame_codec,'\0',(PAYLOAD *)0x0,0,(uchar *)((long)&l_1 + 6)
                       ,2,on_bytes_encoded,callback_context);
    if (iVar1 == 0) {
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqp_frame_codec.c"
                  ,"amqp_frame_codec_encode_empty_frame",0x169,1,
                  "frame_codec_encode_frame failed when encoding empty frame");
      }
      l._4_4_ = 0x16a;
    }
  }
  return l._4_4_;
}

Assistant:

int amqp_frame_codec_encode_empty_frame(AMQP_FRAME_CODEC_HANDLE amqp_frame_codec, uint16_t channel, ON_BYTES_ENCODED on_bytes_encoded, void* callback_context)
{
    int result;

    /* Codes_SRS_AMQP_FRAME_CODEC_01_045: [If amqp_frame_codec is NULL, amqp_frame_codec_encode_empty_frame shall fail and return a non-zero value.] */
    if (amqp_frame_codec == NULL)
    {
        LogError("NULL amqp_frame_codec");
        result = MU_FAILURE;
    }
    else
    {
        unsigned char channel_bytes[2];

        channel_bytes[0] = channel >> 8;
        channel_bytes[1] = channel & 0xFF;

        /* Codes_SRS_AMQP_FRAME_CODEC_01_044: [amqp_frame_codec_encode_empty_frame shall use frame_codec_encode_frame to encode the frame.] */
        if (frame_codec_encode_frame(amqp_frame_codec->frame_codec, FRAME_TYPE_AMQP, NULL, 0, channel_bytes, sizeof(channel_bytes), on_bytes_encoded, callback_context) != 0)
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_046: [If encoding fails in any way, amqp_frame_codec_encode_empty_frame shall fail and return a non-zero value.]  */
            LogError("frame_codec_encode_frame failed when encoding empty frame");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQP_FRAME_CODEC_01_043: [On success, amqp_frame_codec_encode_empty_frame shall return 0.] */
            result = 0;
        }
    }

    return result;
}